

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O2

ostream * operator<<(ostream *out,sockaddr_in *addr)

{
  ostream *poVar1;
  string local_40;
  
  poVar1 = std::operator<<(out,"[");
  bdnet_inet_ntoa_abi_cxx11_(&local_40,(in_addr)(addr->sin_addr).s_addr);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,":");
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = (ostream *)std::ostream::operator<<(out,addr->sin_port << 8 | addr->sin_port >> 8);
  std::operator<<(poVar1,"]");
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, struct sockaddr_in &addr) {
	out << "[" << bdnet_inet_ntoa(addr.sin_addr) << ":";
	out << htons(addr.sin_port) << "]";
	return out;
}